

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O3

void __thiscall duckdb::Transformer::PivotEntryCheck(Transformer *this,string *type)

{
  Transformer *pTVar1;
  pointer pcVar2;
  ParserException *this_00;
  reference this_01;
  pointer pCVar3;
  pointer pPVar4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = (this->parent).ptr;
  while (pTVar1 != (Transformer *)0x0) {
    optional_ptr<duckdb::Transformer,_true>::CheckValid(&this->parent);
    this = (this->parent).ptr;
    pTVar1 = (this->parent).ptr;
  }
  if ((this->pivot_entries).
      super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->pivot_entries).
      super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (ParserException *)__cxa_allocate_exception(0x10);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "PIVOT statements with pivot elements extracted from the data cannot be used in %ss.\nIn order to use PIVOT in a %s the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (type->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + type->_M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar2 = (type->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + type->_M_string_length);
    this_01 = vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
              ::operator[](&this->pivot_entries,0);
    pCVar3 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->(this_01);
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&pCVar3->column);
    (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar4);
    ParserException::ParserException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_b0,&local_70,&local_90,&local_50);
    __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Transformer::PivotEntryCheck(const string &type) {
	auto &entries = GetPivotEntries();
	if (!entries.empty()) {
		throw ParserException(
		    "PIVOT statements with pivot elements extracted from the data cannot be used in %ss.\nIn order to use "
		    "PIVOT in a %s the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)",
		    type, type, entries[0]->column->ToString());
	}
}